

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsg_model.c
# Opt level: O2

int fsg_model_add_alt(fsg_model_t *fsg,char *baseword,char *altword)

{
  hash_table_t *h;
  undefined8 *puVar1;
  int iVar2;
  bitvec_t *pbVar3;
  hash_iter_t *itor;
  undefined8 *ptr;
  glist_t g;
  long lVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  glist_t pgVar9;
  int iVar10;
  
  uVar5 = fsg->n_word;
  uVar8 = 0;
  uVar7 = 0;
  if (0 < (int)uVar5) {
    uVar7 = (ulong)uVar5;
  }
  do {
    if (uVar7 == uVar8) {
LAB_0010a706:
      uVar6 = (uint)uVar7;
      if (uVar6 == uVar5) {
        err_msg(ERR_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                ,0x1b9,"Base word %s not present in FSG vocabulary!\n",baseword);
        iVar10 = -1;
      }
      else {
        iVar2 = fsg_model_word_add(fsg,altword);
        pbVar3 = fsg->altwords;
        if (pbVar3 == (bitvec_t *)0x0) {
          pbVar3 = (bitvec_t *)
                   __ckd_calloc__((long)((fsg->n_word_alloc + 0x1f) / 0x20),4,
                                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                  ,0x1be);
          fsg->altwords = pbVar3;
        }
        uVar5 = 1 << ((byte)iVar2 & 0x1f);
        pbVar3[iVar2 / 0x20] = pbVar3[iVar2 / 0x20] | uVar5;
        pbVar3 = fsg->silwords;
        if ((pbVar3 != (bitvec_t *)0x0) && ((pbVar3[uVar7 >> 5] >> (uVar6 & 0x1f) & 1) != 0)) {
          pbVar3[iVar2 / 0x20] = pbVar3[iVar2 / 0x20] | uVar5;
        }
        iVar10 = 0;
        for (lVar4 = 0; lVar4 < fsg->n_state; lVar4 = lVar4 + 1) {
          h = fsg->trans[lVar4].trans;
          if (h != (hash_table_t *)0x0) {
            for (itor = hash_table_iter(h); itor != (hash_iter_t *)0x0;
                itor = hash_table_iter_next(itor)) {
              pgVar9 = (glist_t)itor->ent->val;
              g = pgVar9;
              for (; pgVar9 != (glist_t)0x0; pgVar9 = pgVar9->next) {
                puVar1 = (undefined8 *)(pgVar9->data).ptr;
                if (*(uint *)((long)puVar1 + 0xc) == uVar6) {
                  ptr = (undefined8 *)
                        __listelem_malloc__(fsg->link_alloc,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/fsg_model.c"
                                            ,0x1dc);
                  *ptr = *puVar1;
                  *(undefined4 *)(ptr + 1) = *(undefined4 *)(puVar1 + 1);
                  *(int *)((long)ptr + 0xc) = iVar2;
                  g = glist_add_ptr(g,ptr);
                  iVar10 = iVar10 + 1;
                }
              }
              itor->ent->val = g;
            }
          }
        }
      }
      return iVar10;
    }
    iVar2 = strcmp(fsg->vocab[uVar8],baseword);
    if (iVar2 == 0) {
      uVar7 = uVar8 & 0xffffffff;
      goto LAB_0010a706;
    }
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

int
fsg_model_add_alt(fsg_model_t * fsg, char const *baseword,
                  char const *altword)
{
    int i, basewid, altwid;
    int ntrans;

    /* FIXME: This will get slow, eventually... */
    for (basewid = 0; basewid < fsg->n_word; ++basewid)
        if (0 == strcmp(fsg->vocab[basewid], baseword))
            break;
    if (basewid == fsg->n_word) {
        E_ERROR("Base word %s not present in FSG vocabulary!\n", baseword);
        return -1;
    }
    altwid = fsg_model_word_add(fsg, altword);
    if (fsg->altwords == NULL)
        fsg->altwords = bitvec_alloc(fsg->n_word_alloc);
    bitvec_set(fsg->altwords, altwid);
    if (fsg_model_is_filler(fsg, basewid)) {
        if (fsg->silwords == NULL)
            fsg->silwords = bitvec_alloc(fsg->n_word_alloc);
        bitvec_set(fsg->silwords, altwid);
    }

    E_DEBUG("Adding alternate word transitions (%s,%s) to FSG\n",
            baseword, altword);

    /* Look for all transitions involving baseword and duplicate them. */
    /* FIXME: This will also get slow, eventually... */
    ntrans = 0;
    for (i = 0; i < fsg->n_state; ++i) {
        hash_iter_t *itor;
        if (fsg->trans[i].trans == NULL)
            continue;
        for (itor = hash_table_iter(fsg->trans[i].trans); itor;
             itor = hash_table_iter_next(itor)) {
            glist_t trans;
            gnode_t *gn;

            trans = hash_entry_val(itor->ent);
            for (gn = trans; gn; gn = gnode_next(gn)) {
                fsg_link_t *fl = gnode_ptr(gn);
                if (fl->wid == basewid) {
                    fsg_link_t *link;

                    /* Create transition object */
                    link = listelem_malloc(fsg->link_alloc);
                    link->from_state = fl->from_state;
                    link->to_state = fl->to_state;
                    link->logs2prob = fl->logs2prob;    /* FIXME!!!??? */
                    link->wid = altwid;

                    trans = glist_add_ptr(trans, (void *) link);
                    ++ntrans;
                }
            }
            hash_entry_val(itor->ent) = trans;
        }
    }

    E_DEBUG("Added %d alternate word transitions\n", ntrans);
    return ntrans;
}